

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::ImageLayer::updateContent(ImageLayer *this)

{
  Int IVar1;
  Asset *pAVar2;
  Layer *in_RDI;
  float fVar3;
  VMatrix *in_stack_ffffffffffffff68;
  Layer *in_stack_ffffffffffffff70;
  Layer *this_00;
  Int local_74;
  undefined1 local_70 [80];
  VRectF local_20;
  Int local_10;
  Int local_c [3];
  
  pAVar2 = internal::model::Layer::asset(in_stack_ffffffffffffff70);
  if (pAVar2 != (Asset *)0x0) {
    local_10 = (Int)Layer::flag(in_RDI);
    local_c[0] = (Int)vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator&
                                ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)
                                 in_stack_ffffffffffffff68,None);
    IVar1 = vFlag::operator_cast_to_unsigned_int((vFlag *)local_c);
    if (IVar1 != 0) {
      VPath::reset((VPath *)0x161161);
      this_00 = (Layer *)&in_RDI[2].mCombinedMatrix;
      pAVar2 = internal::model::Layer::asset(this_00);
      in_stack_ffffffffffffff68 = (VMatrix *)(double)pAVar2->mWidth;
      pAVar2 = internal::model::Layer::asset(this_00);
      VRectF::VRectF(&local_20,0.0,0.0,(double)in_stack_ffffffffffffff68,(double)pAVar2->mHeight);
      VPath::addRect((VPath *)this_00,(VRectF *)in_stack_ffffffffffffff68,CCW);
      Layer::combinedMatrix((Layer *)this_00);
      VPath::transform((VPath *)this_00,in_stack_ffffffffffffff68);
      vFlag<VDrawable::DirtyState>::operator|=
                ((vFlag<VDrawable::DirtyState> *)&in_RDI[1].mCombinedMatrix.m22,Path);
      VPath::operator=((VPath *)this_00,(VPath *)in_stack_ffffffffffffff68);
      Layer::combinedMatrix((Layer *)this_00);
      memcpy(&in_RDI[1].mDirtyFlag,local_70,0x26);
    }
    Layer::flag(in_RDI);
    local_74 = (Int)vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator&
                              ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)
                               in_stack_ffffffffffffff68,None);
    IVar1 = vFlag::operator_cast_to_unsigned_int((vFlag *)&local_74);
    if (IVar1 != 0) {
      fVar3 = Layer::combinedAlpha(in_RDI);
      *(int *)&in_RDI[2].mParentLayer = (int)(fVar3 * 255.0);
    }
  }
  return;
}

Assistant:

void renderer::ImageLayer::updateContent()
{
    if (!mLayerData->asset()) return;

    if (flag() & DirtyFlagBit::Matrix) {
        mPath.reset();
        mPath.addRect(VRectF(0, 0, mLayerData->asset()->mWidth,
                            mLayerData->asset()->mHeight));
        mPath.transform(combinedMatrix());
        mRenderNode.mFlag |= VDrawable::DirtyState::Path;
        mRenderNode.mPath = mPath;
        mTexture.mMatrix = combinedMatrix();
    }

    if (flag() & DirtyFlagBit::Alpha) {
        mTexture.mAlpha = int(combinedAlpha() * 255);
    }
}